

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O1

void __thiscall QFontCache::decreaseCost(QFontCache *this,uint cost)

{
  uint uVar1;
  
  uVar1 = 1;
  if (0x3ff < cost + 0x200) {
    uVar1 = cost + 0x200 >> 10;
  }
  this->total_cost = this->total_cost - uVar1;
  return;
}

Assistant:

void QFontCache::decreaseCost(uint cost)
{
    cost = (cost + 512) / 1024; // cost is stored in kb
    cost = cost > 0 ? cost : 1;
    Q_ASSERT(cost <= total_cost);
    total_cost -= cost;

    FC_DEBUG("  COST: decreased %u kb, total_cost %u kb, max_cost %u kb",
            cost, total_cost, max_cost);
}